

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O3

err_t UnCompressFrameZLib(uint8_t *Cursor,size_t CursorSize,array *OutBuf,size_t *FrameSize,
                         size_t *ArrayOffset)

{
  int iVar1;
  uint uVar2;
  err_t eVar3;
  bool_t bVar4;
  long lVar5;
  z_stream stream;
  uint8_t *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  size_t sStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_98 = 0;
  pcStack_90 = (char *)0x0;
  local_a8 = (uint8_t *)0x0;
  uStack_a0 = 0;
  iVar1 = inflateInit_(&local_a8,"1.2.11",0x70);
  eVar3 = -3;
  if (iVar1 == 0) {
    uStack_a0 = CONCAT44(uStack_a0._4_4_,(int)CursorSize);
    local_a8 = Cursor;
    if (OutBuf == (array *)0x0) {
      __assert_fail("&(*OutBuf)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0xa0,
                    "err_t UnCompressFrameZLib(const uint8_t *, size_t, array *, size_t *, size_t *)"
                   );
    }
    pcStack_90 = OutBuf->_Begin + *ArrayOffset;
    while( true ) {
      lVar5 = (long)pcStack_90 - (long)OutBuf->_Begin;
      bVar4 = ArrayResize(OutBuf,lVar5 + 0x400,0);
      if (bVar4 == 0) break;
      local_88 = CONCAT44(local_88._4_4_,(int)OutBuf->_Used - (int)lVar5);
      pcStack_90 = OutBuf->_Begin + lVar5;
      uVar2 = inflate(&local_a8,0);
      if ((((1 < uVar2) || (uVar2 == 1)) || ((int)uStack_a0 == 0)) || ((int)local_88 != 0))
      goto LAB_0010df12;
    }
    uVar2 = 0xfffffffc;
LAB_0010df12:
    *FrameSize = sStack_80;
    *ArrayOffset = *ArrayOffset + sStack_80;
    inflateEnd();
    eVar3 = (ulong)(uVar2 == 1) * 3 + -3;
  }
  return eVar3;
}

Assistant:

err_t UnCompressFrameZLib(const uint8_t *Cursor, size_t CursorSize, array *OutBuf, size_t *FrameSize, size_t *ArrayOffset)
{
    z_stream stream;
    int Res;
    err_t Err = ERR_NONE;

    memset(&stream,0,sizeof(stream));
    Res = inflateInit(&stream);
    if (Res != Z_OK)
        Err = ERR_INVALID_DATA;
    else
    {
        size_t Count;
        stream.next_in = (Bytef*)Cursor;
        stream.avail_in = CursorSize;
        stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + *ArrayOffset;
        do {
            Count = stream.next_out - ARRAYBEGIN(*OutBuf,uint8_t);
            if (!ArrayResize(OutBuf, Count + 1024, 0))
            {
                Res = Z_MEM_ERROR;
                break;
            }
            stream.avail_out = ARRAYCOUNT(*OutBuf,uint8_t) - Count;
            stream.next_out = ARRAYBEGIN(*OutBuf,uint8_t) + Count;
            Res = inflate(&stream, Z_NO_FLUSH);
            if (Res!=Z_STREAM_END && Res!=Z_OK)
                break;
        } while (Res!=Z_STREAM_END && stream.avail_in && !stream.avail_out);
        *FrameSize = stream.total_out;
        *ArrayOffset = *ArrayOffset + stream.total_out;
        inflateEnd(&stream);
        if (Res != Z_STREAM_END)
            Err = ERR_INVALID_DATA;
    }
    return Err;
}